

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O2

exr_result_t validate_req_attr(exr_context_t f,exr_priv_part_t curpart,int adddefault)

{
  exr_attr_m33d_t *peVar1;
  exr_result_t eVar2;
  exr_result_t eVar3;
  _func_exr_result_t_exr_const_context_t_exr_result_t_char_ptr_varargs *UNRECOVERED_JUMPTABLE;
  char *pcVar4;
  exr_result_t eStackY_40;
  
  if (curpart->compression == (exr_attribute_t *)0x0) {
    if (adddefault != 0) {
      eVar3 = exr_attr_list_add_static_name
                        (f,&curpart->attributes,"compression",EXR_ATTR_COMPRESSION,0,(uint8_t **)0x0
                         ,&curpart->compression);
      if (eVar3 != 0) {
        return eVar3;
      }
      (curpart->compression->field_6).uc = '\x03';
      curpart->comp_type = EXR_COMPRESSION_ZIP;
      goto LAB_0012ae88;
    }
    UNRECOVERED_JUMPTABLE = f->print_error;
    pcVar4 = "\'compression\' attribute not found";
  }
  else {
    if (curpart->compression->type != EXR_ATTR_COMPRESSION) {
      UNRECOVERED_JUMPTABLE = f->print_error;
      pcVar4 = "\'compression\' attribute has wrong data type";
LAB_0012b257:
      eStackY_40 = 0x10;
      goto LAB_0012b259;
    }
LAB_0012ae88:
    if (curpart->dataWindow == (exr_attribute_t *)0x0) {
      if (adddefault == 0) {
        UNRECOVERED_JUMPTABLE = f->print_error;
        pcVar4 = "\'dataWindow\' attribute not found";
        goto LAB_0012b248;
      }
      eVar3 = exr_attr_list_add_static_name
                        (f,&curpart->attributes,"dataWindow",EXR_ATTR_BOX2I,0,(uint8_t **)0x0,
                         &curpart->dataWindow);
      if (eVar3 != 0) {
        return eVar3;
      }
      peVar1 = (curpart->dataWindow->field_6).m33d;
      peVar1->m[0] = 0.0;
      peVar1->m[1] = 1.33685734861938e-312;
      (curpart->data_window).min.x = 0;
      (curpart->data_window).min.y = 0;
      (curpart->data_window).max.x = 0x3f;
      (curpart->data_window).max.y = 0x3f;
      eVar3 = internal_exr_compute_tile_information(f,curpart,1);
    }
    else {
      eVar3 = 0;
      if (curpart->dataWindow->type != EXR_ATTR_BOX2I) {
        UNRECOVERED_JUMPTABLE = f->print_error;
        pcVar4 = "\'dataWindow\' attribute has wrong data type";
        goto LAB_0012b257;
      }
    }
    if (curpart->displayWindow == (exr_attribute_t *)0x0) {
      if (adddefault == 0) {
        UNRECOVERED_JUMPTABLE = f->print_error;
        pcVar4 = "\'displayWindow\' attribute not found";
        goto LAB_0012b248;
      }
      eVar3 = 0;
      eVar2 = exr_attr_list_add_static_name
                        (f,&curpart->attributes,"displayWindow",EXR_ATTR_BOX2I,0,(uint8_t **)0x0,
                         &curpart->displayWindow);
      if (eVar2 != 0) {
        return eVar2;
      }
      peVar1 = (curpart->displayWindow->field_6).m33d;
      peVar1->m[0] = 0.0;
      peVar1->m[1] = 1.33685734861938e-312;
      (curpart->display_window).min.x = 0;
      (curpart->display_window).min.y = 0;
      (curpart->display_window).max.x = 0x3f;
      (curpart->display_window).max.y = 0x3f;
    }
    else if (curpart->displayWindow->type != EXR_ATTR_BOX2I) {
      UNRECOVERED_JUMPTABLE = f->print_error;
      pcVar4 = "\'displayWindow\' attribute has wrong data type";
      goto LAB_0012b257;
    }
    if (curpart->lineOrder == (exr_attribute_t *)0x0) {
      if (adddefault == 0) {
        UNRECOVERED_JUMPTABLE = f->print_error;
        pcVar4 = "\'lineOrder\' attribute not found";
        goto LAB_0012b248;
      }
      eVar3 = 0;
      eVar2 = exr_attr_list_add_static_name
                        (f,&curpart->attributes,"lineOrder",EXR_ATTR_LINEORDER,0,(uint8_t **)0x0,
                         &curpart->lineOrder);
      if (eVar2 != 0) {
        return eVar2;
      }
      (curpart->lineOrder->field_6).uc = '\0';
      curpart->lineorder = EXR_LINEORDER_INCREASING_Y;
    }
    else if (curpart->lineOrder->type != EXR_ATTR_LINEORDER) {
      UNRECOVERED_JUMPTABLE = f->print_error;
      pcVar4 = "\'lineOrder\' attribute has wrong data type";
      goto LAB_0012b257;
    }
    if (curpart->pixelAspectRatio == (exr_attribute_t *)0x0) {
      if (adddefault == 0) {
        UNRECOVERED_JUMPTABLE = f->print_error;
        pcVar4 = "\'pixelAspectRatio\' attribute not found";
        goto LAB_0012b248;
      }
      eVar3 = 0;
      eVar2 = exr_attr_list_add_static_name
                        (f,&curpart->attributes,"pixelAspectRatio",EXR_ATTR_FLOAT,0,(uint8_t **)0x0,
                         &curpart->pixelAspectRatio);
      if (eVar2 != 0) {
        return eVar2;
      }
      (curpart->pixelAspectRatio->field_6).i = 0x3f800000;
    }
    else if (curpart->pixelAspectRatio->type != EXR_ATTR_FLOAT) {
      UNRECOVERED_JUMPTABLE = f->print_error;
      pcVar4 = "\'pixelAspectRatio\' attribute has wrong data type";
      goto LAB_0012b257;
    }
    if (curpart->screenWindowCenter == (exr_attribute_t *)0x0) {
      if (adddefault == 0) {
        UNRECOVERED_JUMPTABLE = f->print_error;
        pcVar4 = "\'screenWindowCenter\' attribute not found";
        goto LAB_0012b248;
      }
      eVar3 = 0;
      eVar2 = exr_attr_list_add_static_name
                        (f,&curpart->attributes,"screenWindowCenter",EXR_ATTR_V2F,0,(uint8_t **)0x0,
                         &curpart->screenWindowCenter);
      if (eVar2 != 0) {
        return eVar2;
      }
      ((curpart->screenWindowCenter->field_6).m33d)->m[0] = 0.0;
    }
    else if (curpart->screenWindowCenter->type != EXR_ATTR_V2F) {
      UNRECOVERED_JUMPTABLE = f->print_error;
      pcVar4 = "\'screenWindowCenter\' attribute has wrong data type";
      goto LAB_0012b257;
    }
    if (curpart->screenWindowWidth == (exr_attribute_t *)0x0) {
      if (adddefault == 0) {
        UNRECOVERED_JUMPTABLE = f->print_error;
        pcVar4 = "\'screenWindowWidth\' attribute not found";
        goto LAB_0012b248;
      }
      eVar3 = 0;
      eVar2 = exr_attr_list_add_static_name
                        (f,&curpart->attributes,"screenWindowWidth",EXR_ATTR_FLOAT,0,(uint8_t **)0x0
                         ,&curpart->screenWindowWidth);
      if (eVar2 != 0) {
        return eVar2;
      }
      (curpart->screenWindowWidth->field_6).i = 0x3f800000;
    }
    else if (curpart->screenWindowWidth->type != EXR_ATTR_FLOAT) {
      UNRECOVERED_JUMPTABLE = f->print_error;
      pcVar4 = "\'screenWindowWidth\' attribute has wrong data type, expect float";
      goto LAB_0012b257;
    }
    if (f->is_multipart == '\0') {
      if (f->has_nonimage_data == '\0') {
        return eVar3;
      }
    }
    else {
      if (curpart->name == (exr_attribute_t *)0x0) {
        UNRECOVERED_JUMPTABLE = f->print_error;
        pcVar4 = "\'name\' attribute for multipart file not found";
        goto LAB_0012b248;
      }
      if (curpart->name->type != EXR_ATTR_STRING) {
        UNRECOVERED_JUMPTABLE = f->print_error;
        pcVar4 = "\'name\' attribute has wrong data type, expect string";
        goto LAB_0012b257;
      }
    }
    if (curpart->type == (exr_attribute_t *)0x0) {
      UNRECOVERED_JUMPTABLE = f->print_error;
      pcVar4 = "\'type\' attribute for v2+ file not found";
    }
    else {
      if (curpart->type->type != EXR_ATTR_STRING) {
        UNRECOVERED_JUMPTABLE = f->print_error;
        pcVar4 = "\'type\' attribute has wrong data type, expect string";
        goto LAB_0012b257;
      }
      if ((f->has_nonimage_data != '\0') && (curpart->version == (exr_attribute_t *)0x0)) {
        if (adddefault == 0) {
          UNRECOVERED_JUMPTABLE = f->print_error;
          pcVar4 = "\'version\' attribute for deep file not found";
          goto LAB_0012b248;
        }
        eVar3 = exr_attr_list_add_static_name
                          (f,&curpart->attributes,"version",EXR_ATTR_INT,0,(uint8_t **)0x0,
                           &curpart->version);
        (curpart->version->field_6).f = 1.4013e-45;
      }
      if ((f->strict_header == '\0') || (curpart->chunkCount != (exr_attribute_t *)0x0)) {
        return eVar3;
      }
      UNRECOVERED_JUMPTABLE = f->print_error;
      pcVar4 = "\'chunkCount\' attribute for multipart / deep file not found";
    }
  }
LAB_0012b248:
  eStackY_40 = 0xd;
LAB_0012b259:
  eVar3 = (*UNRECOVERED_JUMPTABLE)(f,eStackY_40,pcVar4,UNRECOVERED_JUMPTABLE);
  return eVar3;
}

Assistant:

static exr_result_t
validate_req_attr (exr_context_t f, exr_priv_part_t curpart, int adddefault)
{
    exr_result_t rv = EXR_ERR_SUCCESS;

    if (!curpart->compression)
    {
        if (adddefault)
        {
            rv = exr_attr_list_add_static_name (
                (exr_context_t) f,
                &(curpart->attributes),
                "compression",
                EXR_ATTR_COMPRESSION,
                0,
                NULL,
                &(curpart->compression));
            if (rv != EXR_ERR_SUCCESS) return rv;
            curpart->compression->uc = (uint8_t) EXR_COMPRESSION_ZIP;
            curpart->comp_type       = EXR_COMPRESSION_ZIP;
        }
        else
        {
            return f->print_error (
                f,
                EXR_ERR_MISSING_REQ_ATTR,
                "'compression' attribute not found");
        }
    }
    else if (curpart->compression->type != EXR_ATTR_COMPRESSION)
        return f->print_error (
            f,
            EXR_ERR_ATTR_TYPE_MISMATCH,
            "'compression' attribute has wrong data type");

    if (!curpart->dataWindow)
    {
        if (adddefault)
        {
            exr_attr_box2i_t defdw = {{.x = 0, .y = 0}, {.x = 63, .y = 63}};
            rv                     = exr_attr_list_add_static_name (
                (exr_context_t) f,
                &(curpart->attributes),
                "dataWindow",
                EXR_ATTR_BOX2I,
                0,
                NULL,
                &(curpart->dataWindow));
            if (rv != EXR_ERR_SUCCESS) return rv;
            *(curpart->dataWindow->box2i) = defdw;
            curpart->data_window          = defdw;

            rv = internal_exr_compute_tile_information (f, curpart, 1);
        }
        else
        {
            return f->print_error (
                f,
                EXR_ERR_MISSING_REQ_ATTR,
                "'dataWindow' attribute not found");
        }
    }
    else if (curpart->dataWindow->type != EXR_ATTR_BOX2I)
        return f->print_error (
            f,
            EXR_ERR_ATTR_TYPE_MISMATCH,
            "'dataWindow' attribute has wrong data type");

    if (!curpart->displayWindow)
    {
        if (adddefault)
        {
            exr_attr_box2i_t defdw = {{.x = 0, .y = 0}, {.x = 63, .y = 63}};
            rv                     = exr_attr_list_add_static_name (
                (exr_context_t) f,
                &(curpart->attributes),
                "displayWindow",
                EXR_ATTR_BOX2I,
                0,
                NULL,
                &(curpart->displayWindow));
            if (rv != EXR_ERR_SUCCESS) return rv;
            *(curpart->displayWindow->box2i) = defdw;
            curpart->display_window          = defdw;
        }
        else
        {
            return f->print_error (
                f,
                EXR_ERR_MISSING_REQ_ATTR,
                "'displayWindow' attribute not found");
        }
    }
    else if (curpart->displayWindow->type != EXR_ATTR_BOX2I)
        return f->print_error (
            f,
            EXR_ERR_ATTR_TYPE_MISMATCH,
            "'displayWindow' attribute has wrong data type");

    if (!curpart->lineOrder)
    {
        if (adddefault)
        {
            rv = exr_attr_list_add_static_name (
                (exr_context_t) f,
                &(curpart->attributes),
                "lineOrder",
                EXR_ATTR_LINEORDER,
                0,
                NULL,
                &(curpart->lineOrder));
            if (rv != EXR_ERR_SUCCESS) return rv;
            curpart->lineOrder->uc = (uint8_t) EXR_LINEORDER_INCREASING_Y;
            curpart->lineorder     = EXR_LINEORDER_INCREASING_Y;
        }
        else
        {
            return f->print_error (
                f, EXR_ERR_MISSING_REQ_ATTR, "'lineOrder' attribute not found");
        }
    }
    else if (curpart->lineOrder->type != EXR_ATTR_LINEORDER)
        return f->print_error (
            f,
            EXR_ERR_ATTR_TYPE_MISMATCH,
            "'lineOrder' attribute has wrong data type");

    if (!curpart->pixelAspectRatio)
    {
        if (adddefault)
        {
            rv = exr_attr_list_add_static_name (
                (exr_context_t) f,
                &(curpart->attributes),
                "pixelAspectRatio",
                EXR_ATTR_FLOAT,
                0,
                NULL,
                &(curpart->pixelAspectRatio));
            if (rv != EXR_ERR_SUCCESS) return rv;
            curpart->pixelAspectRatio->f = 1.f;
        }
        else
        {
            return f->print_error (
                f,
                EXR_ERR_MISSING_REQ_ATTR,
                "'pixelAspectRatio' attribute not found");
        }
    }
    else if (curpart->pixelAspectRatio->type != EXR_ATTR_FLOAT)
        return f->print_error (
            f,
            EXR_ERR_ATTR_TYPE_MISMATCH,
            "'pixelAspectRatio' attribute has wrong data type");

    if (!curpart->screenWindowCenter)
    {
        if (adddefault)
        {
            exr_attr_v2f_t defswc = {.x = 0.f, .y = 0.f};
            rv                    = exr_attr_list_add_static_name (
                (exr_context_t) f,
                &(curpart->attributes),
                "screenWindowCenter",
                EXR_ATTR_V2F,
                0,
                NULL,
                &(curpart->screenWindowCenter));
            if (rv != EXR_ERR_SUCCESS) return rv;
            *(curpart->screenWindowCenter->v2f) = defswc;
        }
        else
        {
            return f->print_error (
                f,
                EXR_ERR_MISSING_REQ_ATTR,
                "'screenWindowCenter' attribute not found");
        }
    }
    else if (curpart->screenWindowCenter->type != EXR_ATTR_V2F)
        return f->print_error (
            f,
            EXR_ERR_ATTR_TYPE_MISMATCH,
            "'screenWindowCenter' attribute has wrong data type");

    if (!curpart->screenWindowWidth)
    {
        if (adddefault)
        {
            rv = exr_attr_list_add_static_name (
                (exr_context_t) f,
                &(curpart->attributes),
                "screenWindowWidth",
                EXR_ATTR_FLOAT,
                0,
                NULL,
                &(curpart->screenWindowWidth));
            if (rv != EXR_ERR_SUCCESS) return rv;
            curpart->screenWindowWidth->f = 1.f;
        }
        else
        {
            return f->print_error (
                f,
                EXR_ERR_MISSING_REQ_ATTR,
                "'screenWindowWidth' attribute not found");
        }
    }
    else if (curpart->screenWindowWidth->type != EXR_ATTR_FLOAT)
        return f->print_error (
            f,
            EXR_ERR_ATTR_TYPE_MISMATCH,
            "'screenWindowWidth' attribute has wrong data type, expect float");

    if (f->is_multipart || f->has_nonimage_data)
    {
        if (f->is_multipart)
        {
            if (!curpart->name)
                return f->print_error (
                    f,
                    EXR_ERR_MISSING_REQ_ATTR,
                    "'name' attribute for multipart file not found");
            else if (curpart->name->type != EXR_ATTR_STRING)
                return f->print_error (
                    f,
                    EXR_ERR_ATTR_TYPE_MISMATCH,
                    "'name' attribute has wrong data type, expect string");
        }
        if (!curpart->type)
        {
            return f->print_error (
                f,
                EXR_ERR_MISSING_REQ_ATTR,
                "'type' attribute for v2+ file not found");
        }
        else if (curpart->type->type != EXR_ATTR_STRING)
            return f->print_error (
                f,
                EXR_ERR_ATTR_TYPE_MISMATCH,
                "'type' attribute has wrong data type, expect string");
        if (f->has_nonimage_data && !curpart->version)
        {
            if (adddefault)
            {
                rv = exr_attr_list_add_static_name (
                    f,
                    &(curpart->attributes),
                    EXR_REQ_VERSION_STR,
                    EXR_ATTR_INT,
                    0,
                    NULL,
                    &(curpart->version));
                curpart->version->i = 1;
            }
            else
            {
                return f->print_error (
                    f,
                    EXR_ERR_MISSING_REQ_ATTR,
                    "'version' attribute for deep file not found");
            }
        }
        if (f->strict_header && !curpart->chunkCount)
            return f->print_error (
                f,
                EXR_ERR_MISSING_REQ_ATTR,
                "'chunkCount' attribute for multipart / deep file not found");
    }

    return rv;
}